

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_21_term(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = G->val[-3];
  if (pPVar1 == (PVIPNode *)0x0) {
    pPVar1 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_CONTEXTUALIZER_ARRAY,pPVar1);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_21_term(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define t G->val[-1]
#define b G->val[-2]
#define e G->val[-3]
  yyprintf((stderr, "do yy_21_term"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = CHILDREN1(PVIP_NODE_CONTEXTUALIZER_ARRAY,  MAYBE(e)); }\n"));
  yy = CHILDREN1(PVIP_NODE_CONTEXTUALIZER_ARRAY,  MAYBE(e)); ;
#undef t
#undef b
#undef e
}